

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_util.hpp
# Opt level: O0

string * __thiscall
ot::commissioner::ToString_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,LogLevel aLevel)

{
  LogLevel aLevel_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xff) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ off   ]");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ crit  ]");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ error ]");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ warn  ]");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ info  ]");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"[ debug ]");
    break;
  default:
    abort();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(LogLevel aLevel)
{
    std::string ret;

    switch (aLevel)
    {
    case LogLevel::kOff:
        ret = "[ off   ]";
        break;
    case LogLevel::kCritical:
        ret = "[ crit  ]";
        break;
    case LogLevel::kError:
        ret = "[ error ]";
        break;
    case LogLevel::kWarn:
        ret = "[ warn  ]";
        break;
    case LogLevel::kInfo:
        ret = "[ info  ]";
        break;
    case LogLevel::kDebug:
        ret = "[ debug ]";
        break;
    default:
        VerifyOrDie(false);
        break;
    }

    return ret;
}